

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestShaderType TVar1;
  ulong *puVar2;
  undefined1 *puVar3;
  TestError *pTVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  string *psVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  string *psVar13;
  ulong uVar14;
  bool bVar15;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  TestShaderType local_194;
  long local_190;
  ExpressionsInvalid2<glcts::ArraysOfArrays::Interface::GL> *local_188;
  string base_variable_string;
  long *local_160 [2];
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  string valid_relation_opeartors;
  string shader_variable_declarations [2];
  string variable_relation_opeartors [4];
  
  psVar8 = &shader_source;
  puVar12 = (undefined1 *)&shader_source;
  puVar3 = (undefined1 *)&shader_source;
  shader_variable_declarations[0]._M_dataplus._M_p =
       (pointer)&shader_variable_declarations[0].field_2;
  local_188 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)shader_variable_declarations," x","");
  shader_variable_declarations[1]._M_dataplus._M_p =
       (pointer)&shader_variable_declarations[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(shader_variable_declarations + 1)," y","");
  variable_relation_opeartors[0]._M_dataplus._M_p = (pointer)&variable_relation_opeartors[0].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)variable_relation_opeartors,
             "    float result = 0.0;\n\n    if(x < y)\n    {\n        result = 1.0;\n    }\n\n\n",
             "");
  variable_relation_opeartors[1]._M_dataplus._M_p = (pointer)&variable_relation_opeartors[1].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_relation_opeartors + 1),
             "    float result = 0.0;\n\n    if(x <= y)\n    {\n        result = 1.0;\n    }\n\n\n",
             "");
  variable_relation_opeartors[2]._M_dataplus._M_p = (pointer)&variable_relation_opeartors[2].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_relation_opeartors + 2),
             "    float result = 0.0;\n\n    if(x > y)\n    {\n        result = 1.0;\n    }\n\n\n",
             "");
  variable_relation_opeartors[3]._M_dataplus._M_p = (pointer)&variable_relation_opeartors[3].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_relation_opeartors + 3),
             "    float result = 0.0;\n\n    if(x >= y)\n    {\n        result = 1.0;\n    }\n\n\n",
             "");
  valid_relation_opeartors._M_dataplus._M_p = (pointer)&valid_relation_opeartors.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&valid_relation_opeartors,
             "    float result = 0.0;\n\n    if(x == y)\n    {\n        result = 1.0;\n    }\n\n\n",
             "");
  lVar5 = 0x222cb38;
  if (supported_variable_types_map._16_8_ != 0) {
    lVar5 = 0x222cb38;
    lVar6 = supported_variable_types_map._16_8_;
    do {
      if (*(int *)Interface::GL::var_types <= *(int *)(lVar6 + 0x20)) {
        lVar5 = lVar6;
      }
      lVar6 = *(long *)(lVar6 + 0x10 +
                       (ulong)(*(int *)(lVar6 + 0x20) < *(int *)Interface::GL::var_types) * 8);
    } while (lVar6 != 0);
  }
  lVar6 = 0x222cb38;
  if ((lVar5 != 0x222cb38) &&
     (lVar6 = lVar5, *(int *)Interface::GL::var_types < *(int *)(lVar5 + 0x20))) {
    lVar6 = 0x222cb38;
  }
  local_194 = tested_shader_type;
  if (lVar6 == 0x222cb38) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Type not found.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1156);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  base_variable_string._M_dataplus._M_p = (pointer)&base_variable_string.field_2;
  base_variable_string._M_string_length = 0;
  base_variable_string.field_2._M_local_buf[0] = '\0';
  local_190 = 0;
  do {
    std::__cxx11::string::_M_append((char *)&base_variable_string,*(ulong *)(lVar6 + 0x28));
    std::__cxx11::string::_M_append
              ((char *)&base_variable_string,
               (ulong)shader_variable_declarations[local_190]._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&base_variable_string);
    lVar5 = 8;
    do {
      local_160[0] = local_150;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_160,*(long *)(lVar6 + 0x28),
                 *(long *)(lVar6 + 0x30) + *(long *)(lVar6 + 0x28));
      local_140[0] = local_130;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"[1]","");
      (*(local_188->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[6])
                (&shader_source,local_188,local_160,(string *)local_140,lVar5);
      std::__cxx11::string::_M_append
                ((char *)&base_variable_string,(ulong)shader_source._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
        operator_delete(shader_source._M_dataplus._M_p,
                        CONCAT71(shader_source.field_2._M_allocated_capacity._1_7_,
                                 shader_source.field_2._M_local_buf[0]) + 1);
      }
      if (local_140[0] != local_130) {
        operator_delete(local_140[0],local_130[0] + 1);
      }
      if (local_160[0] != local_150) {
        operator_delete(local_160[0],local_150[0] + 1);
      }
      std::__cxx11::string::append((char *)&base_variable_string);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    std::__cxx11::string::_M_append((char *)&base_variable_string,*(ulong *)(lVar6 + 0x68));
    lVar5 = 8;
    do {
      std::__cxx11::string::append((char *)&base_variable_string);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    std::__cxx11::string::append((char *)&base_variable_string);
    lVar5 = local_190 + 1;
    bVar15 = local_190 == 0;
    local_190 = lVar5;
  } while (bVar15);
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,base_variable_string._M_dataplus._M_p,
             base_variable_string._M_dataplus._M_p + base_variable_string._M_string_length);
  std::__cxx11::string::append((char *)&local_1b8);
  TVar1 = local_194;
  std::__cxx11::string::operator=((string *)&shader_source,(string *)&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shader_start_abi_cxx11_,&valid_relation_opeartors);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (TESSELATION_EVALUATION_SHADER_TYPE < TVar1) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1140);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar14 = (ulong)TVar1;
  puVar2 = &set_tesseation_abi_cxx11_;
  switch(uVar14) {
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 3:
    puVar2 = &emit_quad_abi_cxx11_;
  case 4:
    std::__cxx11::string::_M_append((char *)&shader_source,*puVar2);
  }
  std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
  puVar10 = empty_string_abi_cxx11_;
  puVar9 = empty_string_abi_cxx11_;
  puVar7 = (undefined8 *)empty_string_abi_cxx11_;
  puVar11 = empty_string_abi_cxx11_;
  psVar13 = (string *)empty_string_abi_cxx11_;
  switch(uVar14) {
  case 0:
    puVar3 = empty_string_abi_cxx11_;
    puVar10 = default_vertex_shader_source_abi_cxx11_;
    puVar9 = default_tc_shader_source_abi_cxx11_;
    puVar7 = &default_te_shader_source_abi_cxx11_;
    puVar11 = default_geometry_shader_source_abi_cxx11_;
    psVar13 = &shader_source;
    goto switchD_00b644c9_caseD_2;
  case 1:
    puVar9 = default_tc_shader_source_abi_cxx11_;
    puVar10 = (undefined1 *)&shader_source;
    break;
  case 2:
    goto switchD_00b644c9_caseD_2;
  case 3:
    puVar10 = default_vertex_shader_source_abi_cxx11_;
    puVar9 = default_tc_shader_source_abi_cxx11_;
    psVar8 = (string *)&default_te_shader_source_abi_cxx11_;
    goto LAB_00b6454c;
  case 4:
    puVar9 = (undefined1 *)&shader_source;
    puVar10 = default_vertex_shader_source_abi_cxx11_;
    break;
  case 5:
    puVar10 = default_vertex_shader_source_abi_cxx11_;
    puVar9 = default_tc_shader_source_abi_cxx11_;
    goto LAB_00b64545;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1142);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  psVar8 = (string *)&default_te_shader_source_abi_cxx11_;
LAB_00b64545:
  puVar12 = default_geometry_shader_source_abi_cxx11_;
LAB_00b6454c:
  puVar3 = empty_string_abi_cxx11_;
  puVar7 = &psVar8->_M_dataplus;
  puVar11 = puVar12;
  psVar13 = (string *)default_fragment_shader_source_abi_cxx11_;
switchD_00b644c9_caseD_2:
  (*(local_188->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
    super_TestNode._vptr_TestNode[10])(local_188,puVar10,puVar9,puVar7,puVar11,psVar13,puVar3,1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
    operator_delete(shader_source._M_dataplus._M_p,
                    CONCAT71(shader_source.field_2._M_allocated_capacity._1_7_,
                             shader_source.field_2._M_local_buf[0]) + 1);
  }
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,base_variable_string._M_dataplus._M_p,
             base_variable_string._M_dataplus._M_p + base_variable_string._M_string_length);
  std::__cxx11::string::append((char *)&local_1b8);
  std::__cxx11::string::operator=((string *)&shader_source,(string *)&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_1b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &shader_start_abi_cxx11_,variable_relation_opeartors);
  std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_1b8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_194) {
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x114f);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*(code *)(&DAT_01b0e920 + *(int *)(&DAT_01b0e920 + uVar14 * 4)))();
  return;
}

Assistant:

void ExpressionsInvalid2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{

	std::string shader_variable_declarations[] = { " x", " y" };
	std::string variable_relation_opeartors[]  = {
		"    float result = 0.0;\n\n    if(x < y)\n    {\n        result = 1.0;\n    }\n\n\n",
		"    float result = 0.0;\n\n    if(x <= y)\n    {\n        result = 1.0;\n    }\n\n\n",
		"    float result = 0.0;\n\n    if(x > y)\n    {\n        result = 1.0;\n    }\n\n\n",
		"    float result = 0.0;\n\n    if(x >= y)\n    {\n        result = 1.0;\n    }\n\n\n"
	};
	std::string valid_relation_opeartors =
		"    float result = 0.0;\n\n    if(x == y)\n    {\n        result = 1.0;\n    }\n\n\n";

	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_variable_string;

			for (size_t variable_declaration_index = 0;
				 variable_declaration_index <
				 sizeof(shader_variable_declarations) / sizeof(shader_variable_declarations[0]);
				 variable_declaration_index++)
			{
				base_variable_string += var_iterator->second.type;
				base_variable_string += shader_variable_declarations[variable_declaration_index];

				base_variable_string += "[1][1][1][1][1][1][1][1] = ";

				for (size_t sub_script_index = 0; sub_script_index < API::MAX_ARRAY_DIMENSIONS; sub_script_index++)
				{
					base_variable_string += this->extend_string(var_iterator->second.type, "[1]",
																API::MAX_ARRAY_DIMENSIONS - sub_script_index);
					base_variable_string += "(";
				}

				base_variable_string += var_iterator->second.initializer_with_ones;

				for (size_t sub_script_index = 0; sub_script_index < API::MAX_ARRAY_DIMENSIONS; sub_script_index++)
				{
					base_variable_string += ")";
				}

				base_variable_string += ";\n";
			} /* for (int variable_declaration_index = 0; ...) */

			/* Run positive case */
			{
				std::string shader_source;

				shader_source = base_variable_string + "\n";
				shader_source += shader_start + valid_relation_opeartors;

				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
			}

			/* Run negative cases */
			for (size_t string_index = 0;
				 string_index < sizeof(variable_relation_opeartors) / sizeof(variable_relation_opeartors[0]);
				 string_index++)
			{
				std::string shader_source;

				shader_source = base_variable_string + "\n";
				shader_source += shader_start + variable_relation_opeartors[string_index];

				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				this->execute_negative_test(tested_shader_type, shader_source);
			} /* for (int string_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}